

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseModuleFieldList(WastParser *this,Module *module)

{
  bool bVar1;
  Result RVar2;
  TokenTypePair TVar3;
  reference pMVar4;
  Func *func;
  ImportModuleField *import_field;
  _func_int **pp_Var5;
  FuncDeclaration *decl;
  iterator rhs;
  ExprVisitor local_b0;
  undefined1 local_60 [8];
  iterator __begin2;
  ResolveFuncTypesExprVisitorDelegate delegate;
  
  while (((TVar3 = PeekPair(this), TVar3._M_elems[0] == Lpar && (TVar3._M_elems[1] < First_Literal))
         && ((0x2c008dd800U >> ((ulong)TVar3._M_elems >> 0x20 & 0x3f) & 1) != 0))) {
    RVar2 = ParseModuleField(this,module);
    if ((RVar2.enum_ == Error) &&
       (RVar2 = Synchronize(this,anon_unknown_1::IsModuleField), RVar2.enum_ == Error)) {
      return (Result)Error;
    }
  }
  __begin2.list_ = (intrusive_list<wabt::ModuleField> *)(module->fields).first_;
  local_60 = (undefined1  [8])&module->fields;
  do {
    rhs.node_ = (ModuleField *)0x0;
    rhs.list_ = &module->fields;
    bVar1 = intrusive_list<wabt::ModuleField>::iterator::operator!=((iterator *)local_60,rhs);
    if (!bVar1) {
      return (Result)Ok;
    }
    pMVar4 = intrusive_list<wabt::ModuleField>::iterator::operator*((iterator *)local_60);
    if (pMVar4->type_ == Import) {
      pp_Var5 = pMVar4[1]._vptr_ModuleField;
      if (*(int *)(pp_Var5 + 9) != 0) {
        pp_Var5 = (_func_int **)0x0;
      }
      if (pp_Var5 != (_func_int **)0x0) {
        decl = (FuncDeclaration *)(pp_Var5 + 0xe);
        func = (Func *)0x0;
        goto LAB_00da659f;
      }
    }
    else if (pMVar4->type_ == Func) {
      func = (Func *)(pMVar4 + 1);
      decl = (FuncDeclaration *)&pMVar4[1].loc.filename.size_;
LAB_00da659f:
      anon_unknown_1::ResolveFuncTypeWithEmptySignature(module,decl);
      anon_unknown_1::ResolveImplicitlyDefinedFunctionType(&pMVar4->loc,module,decl);
      if (func != (Func *)0x0) {
        __begin2.node_ = (ModuleField *)&PTR__Delegate_013e3e28;
        ExprVisitor::ExprVisitor(&local_b0,(Delegate *)&__begin2.node_);
        ExprVisitor::VisitFunc(&local_b0,func);
        ExprVisitor::~ExprVisitor(&local_b0);
      }
    }
    intrusive_list<wabt::ModuleField>::iterator::operator++((iterator *)local_60);
  } while( true );
}

Assistant:

Result WastParser::ParseModuleFieldList(Module* module) {
  WABT_TRACE(ParseModuleFieldList);
  while (IsModuleField(PeekPair())) {
    if (Failed(ParseModuleField(module))) {
      CHECK_RESULT(Synchronize(IsModuleField));
    }
  }
  ResolveFuncTypes(module);
  return Result::Ok;
}